

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::setData(CfgNode *this,Data *data)

{
  uint __line;
  Data *pDVar1;
  char *__assertion;
  
  if (data == (Data *)0x0) {
    __assertion = "data != 0";
    __line = 0x28;
  }
  else {
    pDVar1 = (Data *)__dynamic_cast(data,&Data::typeinfo,&PhantomData::typeinfo,0);
    if (pDVar1 == (Data *)0x0) {
      pDVar1 = (Data *)__dynamic_cast(data,&Data::typeinfo,&BlockData::typeinfo,0);
      if (pDVar1 != (Data *)0x0) {
        if (this->m_type == CFG_BLOCK) {
          if (this->m_data == (Data *)0x0) {
LAB_0010513b:
            this->m_data = pDVar1;
            return;
          }
          __assertion = "m_data == 0";
          __line = 0x3d;
          goto LAB_001051db;
        }
        if (this->m_type == CFG_PHANTOM) {
          if (this->m_data != (Data *)0x0) {
            (*this->m_data->_vptr_Data[1])();
            this->m_type = CFG_BLOCK;
            goto LAB_0010513b;
          }
          __assertion = "m_data != 0";
          __line = 0x36;
          goto LAB_001051db;
        }
      }
      __assertion = "false";
      __line = 0x45;
    }
    else if (this->m_data == (Data *)0x0) {
      if (this->m_type == CFG_PHANTOM) {
        this->m_data = pDVar1;
        return;
      }
      __assertion = "m_type == CfgNode::CFG_PHANTOM";
      __line = 0x2d;
    }
    else {
      __assertion = "m_data == 0";
      __line = 0x2c;
    }
  }
LAB_001051db:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                ,__line,"void CfgNode::setData(CfgNode::Data *)");
}

Assistant:

void CfgNode::setData(CfgNode::Data* data) {
	assert(data != 0);

	PhantomData* phantomData = dynamic_cast<PhantomData*>(data);
	if (phantomData) {
		assert(m_data == 0);
		assert(m_type == CfgNode::CFG_PHANTOM);
		m_data = phantomData;
		return;
	}

	BlockData* blockData = dynamic_cast<BlockData*>(data);
	if (blockData) {
		switch (m_type) {
			case CfgNode::CFG_PHANTOM:
				assert(m_data != 0);
				delete m_data;

				m_type = CfgNode::CFG_BLOCK;
				m_data = blockData;
				return;
			case CfgNode::CFG_BLOCK:
				assert(m_data == 0);
				m_data = blockData;
				return;
			default:
				break;
		}
	}

	assert(false);
}